

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

int add_user_callback(void *data,int nr_cols,char **field,char **colName)

{
  int id;
  ostream *poVar1;
  string bio;
  string username;
  string password;
  string alias;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  User local_a8;
  
  std::__cxx11::string::string((string *)&local_a8,*field,(allocator *)&username);
  id = std::__cxx11::stoi((string *)&local_a8,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&username,field[1],(allocator *)&local_a8);
  alias._M_dataplus._M_p = (pointer)&alias.field_2;
  alias._M_string_length = 0;
  alias.field_2._M_local_buf[0] = '\0';
  if (field[2] != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_a8,field[2],(allocator *)&bio);
    std::__cxx11::string::operator=((string *)&alias,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  bio._M_dataplus._M_p = (pointer)&bio.field_2;
  bio._M_string_length = 0;
  bio.field_2._M_local_buf[0] = '\0';
  if (field[3] != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_a8,field[3],(allocator *)&password);
    std::__cxx11::string::operator=((string *)&bio,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  std::__cxx11::string::string((string *)&password,field[4],(allocator *)&local_a8);
  std::__cxx11::string::string((string *)&local_c8,(string *)&username);
  std::__cxx11::string::string((string *)&local_e8,(string *)&alias);
  std::__cxx11::string::string((string *)&local_108,(string *)&bio);
  std::__cxx11::string::string((string *)&local_128,(string *)&password);
  User::User(&local_a8,id,&local_c8,&local_e8,&local_108,&local_128);
  std::vector<User,_std::allocator<User>_>::emplace_back<User>
            ((vector<User,_std::allocator<User>_> *)data,&local_a8);
  User::~User(&local_a8);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,id);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)&username);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&password);
  std::__cxx11::string::~string((string *)&bio);
  std::__cxx11::string::~string((string *)&alias);
  std::__cxx11::string::~string((string *)&username);
  return 0;
}

Assistant:

static int add_user_callback(void *data, int nr_cols, char **field, char **colName)
{
	std::vector<User>* result = static_cast<std::vector<User>*>(data);

	try
	{
		int id = std::stoi(field[0]);
		std::string username(field[1]);
		std::string alias;
		if(field[2] != nullptr)
			alias = std::string(field[2]);
		std::string bio;
		if(field[3] != nullptr)
			bio = std::string(field[3]);
		std::string password(field[4]);

		result->push_back(User(id, username, alias, bio, password));
		std::cout << id << " " << username << std::endl;
	}
	catch (...)
	{
		return 1;
	}

	return 0;
}